

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatTrimDecorations(char *fmt,char *buf,size_t buf_size)

{
  char *fmt_00;
  char *pcVar1;
  unsigned_long in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *fmt_end;
  char *fmt_start;
  char *in_stack_ffffffffffffffb8;
  char *dst;
  char *local_8;
  
  fmt_00 = ImParseFormatFindStart(in_RDI);
  local_8 = in_RDI;
  if ((*fmt_00 == '%') && (pcVar1 = ImParseFormatFindEnd(fmt_00), local_8 = fmt_00, *pcVar1 != '\0')
     ) {
    dst = in_RSI;
    ImMin<unsigned_long>((unsigned_long)(pcVar1 + (1 - (long)fmt_00)),in_RDX);
    ImStrncpy(dst,in_stack_ffffffffffffffb8,0x195784);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, size_t buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((size_t)(fmt_end - fmt_start) + 1, buf_size));
    return buf;
}